

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_time.cpp
# Opt level: O0

Am_String Am_Get_Time_And_Date(void)

{
  char *string;
  Am_String_Data *in_RDI;
  char *s;
  time_t time_ptr;
  Am_String *str;
  
  time_ptr._7_1_ = 0;
  Am_String::Am_String((Am_String *)in_RDI);
  time((time_t *)&s);
  string = ctime((time_t *)&s);
  Am_String::operator=((Am_String *)in_RDI,string);
  return (Am_String)in_RDI;
}

Assistant:

Am_String
Am_Get_Time_And_Date()
{
  Am_String str;
  time_t time_ptr;
  time(&time_ptr);

  char *s = ctime(&time_ptr);
  str = s;
  return str;
}